

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

int rc_pick_q_and_bounds
              (AV1_COMP *cpi,int width,int height,int gf_index,int *bottom_index,int *top_index)

{
  FRAME_UPDATE_TYPE FVar1;
  AV1_PRIMARY *pAVar2;
  int iVar3;
  int iVar4;
  int active_worst_quality_00;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  AV1_COMP *in_RDI;
  int *in_R8;
  int *in_R9;
  int pyramid_level;
  int is_intrl_arf_boost;
  int q;
  int active_worst_quality;
  int active_best_quality;
  int cq_level;
  GF_GROUP *gf_group;
  RefreshFrameInfo *refresh_frame;
  AV1EncoderConfig *oxcf;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  AV1_COMMON *cm;
  int local_94;
  int in_stack_ffffffffffffff90;
  AV1_COMP *cpi_00;
  RefreshFrameInfo *pRVar5;
  AV1_COMP *cpi_01;
  int in_stack_ffffffffffffffe0;
  AV1_COMP *cpi_02;
  int local_4;
  
  pAVar2 = in_RDI->ppi;
  pRVar5 = &in_RDI->refresh_frame;
  cpi_00 = (AV1_COMP *)&in_RDI->ppi->gf_group;
  cpi_01 = (AV1_COMP *)&in_RDI->oxcf;
  cpi_02 = in_RDI;
  iVar3 = frame_is_intra_only(&in_RDI->common);
  iVar3 = get_active_cq_level(&in_RDI->rc,&pAVar2->p_rc,&in_RDI->oxcf,iVar3,cpi_02->superres_mode,
                              (uint)(in_RDI->common).superres_scale_denominator);
  if (*(int *)((cpi_01->enc_quant_dequant_params).quants.y_quant[10] + 6) == 3) {
    local_4 = rc_pick_q_and_bounds_q_mode(cpi_02,in_ESI,in_EDX,in_ECX,in_R8,in_R9);
  }
  else {
    local_94 = 0;
    active_worst_quality_00 = (in_RDI->rc).active_worst_quality;
    FVar1 = ((GF_GROUP *)((cpi_00->enc_quant_dequant_params).quants.y_quant + -1))->update_type
            [in_ECX];
    iVar4 = frame_is_intra_only(&in_RDI->common);
    if (iVar4 == 0) {
      iVar4 = gf_group_pyramid_level((GF_GROUP *)cpi_00,in_ECX);
      if ((iVar4 < 2) || (6 < iVar4)) {
        local_94 = get_active_best_quality
                             ((AV1_COMP *)CONCAT44(in_ESI,in_EDX),in_ECX,in_stack_ffffffffffffffe0,
                              (int)((ulong)in_R8 >> 0x20));
      }
      else {
        iVar4 = (pAVar2->p_rc).active_best_quality[iVar4 + -1] + 1;
        local_94 = active_worst_quality_00;
        if (iVar4 < active_worst_quality_00) {
          local_94 = iVar4;
        }
        local_94 = (active_worst_quality_00 - local_94) / 2 + local_94;
      }
      if (((in_RDI->rc).is_src_frame_alt_ref == 0) &&
         ((((pRVar5->golden_frame & 1U) != 0 || ((pRVar5->alt_ref_frame & 1U) != 0)) ||
          (FVar1 == '\x06')))) {
        active_worst_quality_00 = (local_94 + active_worst_quality_00 * 3 + 2) / 4;
      }
    }
    else {
      get_intra_q_and_bounds
                (cpi_02,in_ESI,in_EDX,(int *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),in_R8,
                 (int)((ulong)in_R9 >> 0x20));
    }
    adjust_active_best_and_worst_quality
              (cpi_01,(int)((ulong)pRVar5 >> 0x20),(int *)cpi_00,(int *)CONCAT44(iVar3,local_94));
    local_4 = get_q(cpi_00,iVar3,local_94,active_worst_quality_00,in_stack_ffffffffffffff90);
    if (((in_RDI->rc).max_frame_bandwidth <= (in_RDI->rc).this_frame_target) &&
       (active_worst_quality_00 < local_4)) {
      active_worst_quality_00 = local_4;
    }
    *in_R9 = active_worst_quality_00;
    *in_R8 = local_94;
  }
  return local_4;
}

Assistant:

static int rc_pick_q_and_bounds(const AV1_COMP *cpi, int width, int height,
                                int gf_index, int *bottom_index,
                                int *top_index) {
  const AV1_COMMON *const cm = &cpi->common;
  const RATE_CONTROL *const rc = &cpi->rc;
  const PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const RefreshFrameInfo *const refresh_frame = &cpi->refresh_frame;
  const GF_GROUP *gf_group = &cpi->ppi->gf_group;
  assert(IMPLIES(has_no_stats_stage(cpi),
                 cpi->oxcf.rc_cfg.mode == AOM_Q &&
                     gf_group->update_type[gf_index] != ARF_UPDATE));
  const int cq_level =
      get_active_cq_level(rc, p_rc, oxcf, frame_is_intra_only(cm),
                          cpi->superres_mode, cm->superres_scale_denominator);

  if (oxcf->rc_cfg.mode == AOM_Q) {
    return rc_pick_q_and_bounds_q_mode(cpi, width, height, gf_index,
                                       bottom_index, top_index);
  }

  int active_best_quality = 0;
  int active_worst_quality = rc->active_worst_quality;
  int q;

  const int is_intrl_arf_boost =
      gf_group->update_type[gf_index] == INTNL_ARF_UPDATE;

  if (frame_is_intra_only(cm)) {
    get_intra_q_and_bounds(cpi, width, height, &active_best_quality,
                           &active_worst_quality, cq_level);
#ifdef STRICT_RC
    active_best_quality = 0;
#endif
  } else {
    //  Active best quality limited by previous layer.
    const int pyramid_level = gf_group_pyramid_level(gf_group, gf_index);

    if ((pyramid_level <= 1) || (pyramid_level > MAX_ARF_LAYERS)) {
      active_best_quality = get_active_best_quality(cpi, active_worst_quality,
                                                    cq_level, gf_index);
    } else {
#if CONFIG_FPMT_TEST
      const int simulate_parallel_frame =
          cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] > 0 &&
          cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE;
      int local_active_best_quality =
          simulate_parallel_frame
              ? p_rc->temp_active_best_quality[pyramid_level - 1]
              : p_rc->active_best_quality[pyramid_level - 1];
      active_best_quality = local_active_best_quality + 1;
#else
      active_best_quality = p_rc->active_best_quality[pyramid_level - 1] + 1;
#endif

      active_best_quality = AOMMIN(active_best_quality, active_worst_quality);
#ifdef STRICT_RC
      active_best_quality += (active_worst_quality - active_best_quality) / 16;
#else
      active_best_quality += (active_worst_quality - active_best_quality) / 2;
#endif
    }

    // For alt_ref and GF frames (including internal arf frames) adjust the
    // worst allowed quality as well. This insures that even on hard
    // sections we don't clamp the Q at the same value for arf frames and
    // leaf (non arf) frames. This is important to the TPL model which assumes
    // Q drops with each arf level.
    if (!(rc->is_src_frame_alt_ref) &&
        (refresh_frame->golden_frame || refresh_frame->alt_ref_frame ||
         is_intrl_arf_boost)) {
      active_worst_quality =
          (active_best_quality + (3 * active_worst_quality) + 2) / 4;
    }
  }

  adjust_active_best_and_worst_quality(
      cpi, is_intrl_arf_boost, &active_worst_quality, &active_best_quality);
  q = get_q(cpi, width, height, active_worst_quality, active_best_quality);

  // Special case when we are targeting the max allowed rate.
  if (rc->this_frame_target >= rc->max_frame_bandwidth &&
      q > active_worst_quality) {
    active_worst_quality = q;
  }

  *top_index = active_worst_quality;
  *bottom_index = active_best_quality;

  assert(*top_index <= rc->worst_quality && *top_index >= rc->best_quality);
  assert(*bottom_index <= rc->worst_quality &&
         *bottom_index >= rc->best_quality);
  assert(q <= rc->worst_quality && q >= rc->best_quality);

  return q;
}